

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

bool __thiscall
GrcManager::AddAllGlyphsToTheAnyClass
          (GrcManager *this,GrcFont *pfont,
          map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
          *hmActualForPseudo)

{
  GrcSymbolTable *this_00;
  Symbol this_01;
  GdlGlyphClassDefn *this_02;
  GdlGlyphDefn *this_03;
  string sStack_78;
  GrpLineAndFile lnf;
  
  this_00 = this->m_psymtbl;
  std::__cxx11::string::string((string *)&sStack_78,"ANY",(allocator *)&lnf);
  this_01 = GrcSymbolTable::FindSymbol(this_00,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  this_02 = GrcSymbolTableEntry::GlyphClassDefnData(this_01);
  this_03 = (GdlGlyphDefn *)operator_new(0xb0);
  GdlGlyphDefn::GdlGlyphDefn(this_03,kglftGlyphID,0,(int)this->m_cwGlyphIDs + -1);
  lnf.m_nLinePre = -1;
  lnf.m_nLineOrig = -1;
  lnf.m_staFile._M_dataplus._M_p = (pointer)&lnf.m_staFile.field_2;
  lnf.m_staFile._M_string_length = 0;
  lnf.m_staFile.field_2._M_local_buf[0] = '\0';
  GdlGlyphClassDefn::AddMember(this_02,(GdlGlyphClassMember *)this_03,&lnf);
  (*(this_02->super_GdlGlyphClassMember).super_GdlDefn._vptr_GdlDefn[0x1b])
            (this_02,pfont,(ulong)(ushort)this->m_cwGlyphIDs,hmActualForPseudo);
  std::__cxx11::string::~string((string *)&lnf.m_staFile);
  return true;
}

Assistant:

bool GrcManager::AddAllGlyphsToTheAnyClass(GrcFont * pfont,
	std::map<utf16, utf16> & hmActualForPseudo)
{
	Symbol psym = m_psymtbl->FindSymbol("ANY");
	GdlGlyphClassDefn * pglfcAny = psym->GlyphClassDefnData();
	Assert(pglfcAny);

	GdlGlyphDefn * pglf = new GdlGlyphDefn(kglftGlyphID, 0, int(m_cwGlyphIDs - 1));
	GrpLineAndFile lnf;	// bogus
	pglfcAny->AddMember(pglf, lnf);

	pglfcAny->AssignGlyphIDs(pfont, gr::gid16(m_cwGlyphIDs), hmActualForPseudo);

	return true;
}